

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blind_item_strategy.cpp
# Opt level: O2

void __thiscall
BlindItemStrategy::generateActions(BlindItemStrategy *this,PlayerSight *sight,Actions *actions)

{
  Randomizer *this_00;
  int iVar1;
  int iVar2;
  Vec2 pos;
  
  if ((this->super_Strategy).disabled != false) {
    return;
  }
  iVar2 = sight->gold;
  if (0x18 < iVar2) {
    iVar1 = sight->round;
    if ((this->prevBomb != -1) && ((iVar1 - this->prevBomb) % 0x3c != 0)) goto LAB_0010822a;
    this->prevBomb = iVar1;
    Actions::emplace(actions,BuyItem,0);
    this_00 = Randomizer::getInstance();
    pos = Randomizer::randPosition(this_00);
    Actions::emplace(actions,UseItem,0,pos);
    iVar2 = iVar2 + -0x19;
  }
  if (iVar2 < 5) {
    return;
  }
  iVar1 = sight->round;
LAB_0010822a:
  if ((this->prevWard != -1) && ((iVar1 - this->prevWard) % 0x96 != 0)) {
    return;
  }
  this->prevWard = iVar1;
  Actions::emplace(actions,BuyItem,1);
  Actions::emplace(actions,UseItem,1,sight->pos);
  return;
}

Assistant:

void BlindItemStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    int gold = sight.gold;
    if (gold >= BombPrice)
    {
        bool flag = false;
        if (prevBomb == -1)
            flag = true;
        else if ((sight.round - prevBomb) % BombCD == 0)
            flag = true;
        if (flag)
        {
            prevBomb = sight.round;
            actions->emplace(BuyItem, BombItem);
            actions->emplace(UseItem, BombItem, Randomizer::getInstance()->randPosition());
            gold -= BombPrice;
        }
    }
    if (gold >= WardPrice)
    {
        bool flag = false;
        if (prevWard == -1)
            flag = true;
        else if ((sight.round - prevWard) % WardCD == 0)
            flag = true;
        if (flag)
        {
            prevWard = sight.round;
            actions->emplace(BuyItem, WardItem);
            actions->emplace(UseItem, WardItem, sight.pos);
        }
    }
}